

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  __pid_t _Var2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  size_type sVar6;
  uint *puVar7;
  double *pdVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  istream *piVar10;
  reference pvVar11;
  reference puVar12;
  mapped_type *pmVar13;
  reference ppVar14;
  void *pvVar15;
  reference pvVar16;
  size_type sVar17;
  size_type sVar18;
  long lVar19;
  Model *this;
  ulong uVar20;
  long in_RSI;
  char *pcVar21;
  uint in_EDI;
  double dVar22;
  rep rVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar28;
  uint i_4;
  time_point t_end_1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> hyp_1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> ref_1;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  rel_hyp;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  rel_ref;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pred_1;
  double lp_2;
  ComputationGraph cg;
  uint *w_2;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tsentence_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *actions_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *sentenceUnkStr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *sentencePos_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *sentence_2;
  uint sii_2;
  uint corpus_size;
  time_point t_start_1;
  double total_heads_1;
  double correct_heads_1;
  double right_2;
  double trs_2;
  double llh_2;
  string softlink;
  text_oarchive oa;
  ofstream out;
  time_point t_end;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> hyp;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> ref;
  double lp_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pred;
  ComputationGraph hg_1;
  uint *w_1;
  iterator __end6;
  iterator __begin6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tsentence_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *actions_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *sentencePos_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *sentence_1;
  uint sii_1;
  time_point t_start;
  double total_heads;
  double correct_heads;
  double right_1;
  double trs_1;
  double llh_1;
  uint dev_size;
  double lp;
  ComputationGraph hg;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *actions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *sentencePos;
  uint *w;
  iterator __end5;
  iterator __begin5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tsentence;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *sentence;
  uint sii;
  int iter;
  bool first;
  double llh;
  double right;
  uint trs;
  uint si;
  double tot_seen;
  uint i_3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  SimpleSGDTrainer sgd;
  text_iarchive ia;
  ifstream in_1;
  ParserBuilder parser;
  Model model;
  uint i_2;
  pair<const_unsigned_int,_unsigned_int> wc;
  iterator __end1_1;
  iterator __begin1_1;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *__range1_1;
  uint word_1;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> sent;
  iterator __end1;
  iterator __begin1;
  map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *__range1;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  counts;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> singletons;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> training_vocab;
  uint id;
  uint i_1;
  istringstream lin;
  string word;
  vector<float,_std::allocator<float>_> v;
  string line;
  ifstream in;
  uint kUNK;
  bool softlinkCreated;
  string fname;
  int best_correct_heads;
  ostringstream os;
  double unk_prob;
  uint unk_strategy;
  uint beam_size;
  variables_map conf;
  uint status_every_i_iterations;
  uint i;
  Model *in_stack_ffffffffffffddc8;
  ParserBuilder *in_stack_ffffffffffffddd0;
  undefined4 uVar29;
  Model *in_stack_ffffffffffffddd8;
  Corpus *in_stack_ffffffffffffdde0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffdde8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffddf0;
  ComputationGraph *in_stack_ffffffffffffde00;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffde08;
  map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *in_stack_ffffffffffffde10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffde18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffde20;
  undefined4 in_stack_ffffffffffffde68;
  undefined4 in_stack_ffffffffffffde6c;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffde70;
  ostream *in_stack_ffffffffffffdf50;
  ostream *in_stack_ffffffffffffdf58;
  ostream *in_stack_ffffffffffffdf60;
  ostream *in_stack_ffffffffffffdf68;
  ostream *in_stack_ffffffffffffe048;
  undefined4 in_stack_ffffffffffffe050;
  real in_stack_ffffffffffffe054;
  Tensor *in_stack_ffffffffffffe058;
  Model *in_stack_ffffffffffffe060;
  mapped_type *in_stack_ffffffffffffe068;
  undefined4 in_stack_ffffffffffffe070;
  real in_stack_ffffffffffffe074;
  _Base_ptr in_stack_ffffffffffffe080;
  variables_map *in_stack_ffffffffffffe1a0;
  string *this_00;
  char **in_stack_ffffffffffffe1a8;
  undefined8 in_stack_ffffffffffffe1b0;
  uint local_1b9c;
  duration<double,_std::ratio<1L,_1000L>_> local_1b90;
  undefined8 local_1b88;
  string *in_stack_ffffffffffffe4b8;
  Corpus *in_stack_ffffffffffffe4c0;
  Model local_1b20;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  Model local_1a58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1a08;
  undefined1 *local_1a00;
  undefined1 local_19f8 [28];
  uint local_19dc;
  mapped_type *local_19d8;
  uint local_19cc;
  mapped_type *local_19c8;
  uint local_19bc;
  mapped_type *local_19b8;
  uint local_19ac;
  mapped_type *local_19a8;
  uint local_19a0;
  uint local_199c;
  undefined8 local_1998;
  unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *in_stack_ffffffffffffe670;
  double dVar30;
  Model *in_stack_ffffffffffffe678;
  double dVar31;
  ParserBuilder *in_stack_ffffffffffffe680;
  double dVar32;
  double local_1978;
  double local_1970;
  allocator local_1961;
  string local_1960 [24];
  string *in_stack_ffffffffffffe6b8;
  Corpus *in_stack_ffffffffffffe6c0;
  string local_1920 [39];
  allocator local_18f9;
  string local_18f8 [32];
  string local_18d8 [39];
  allocator local_18b1;
  string local_18b0 [168];
  undefined1 local_1808 [288];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffe918;
  _Base_ptr in_stack_ffffffffffffe920;
  _Base_ptr in_stack_ffffffffffffe928;
  ComputationGraph *in_stack_ffffffffffffe930;
  ParserBuilder *in_stack_ffffffffffffe938;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffe950;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe958;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffe960;
  double *in_stack_ffffffffffffe968;
  duration<double,_std::ratio<1L,_1000L>_> local_1600;
  undefined8 local_15f8;
  undefined8 local_1590;
  Model local_1588;
  uint *local_1518;
  uint *local_1510;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1508;
  undefined1 *local_1500;
  undefined1 local_14f8 [28];
  uint local_14dc;
  mapped_type *local_14d8;
  uint local_14cc;
  mapped_type *local_14c8;
  uint local_14bc;
  mapped_type *local_14b8;
  uint local_14ac;
  undefined8 local_14a8;
  double local_14a0;
  double local_1498;
  double local_1490;
  double local_1488;
  double local_1480;
  uint local_1474;
  _Base_ptr local_1470;
  value_type local_1414;
  Model *local_1410;
  value_type local_1404;
  mapped_type *local_1400;
  uint *local_13f8;
  uint *local_13f0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_13e8;
  _Rb_tree_node_base *local_13e0;
  _Rb_tree_node_base local_13d8;
  _Base_ptr local_13b8;
  _Base_ptr local_13b0;
  _Base_ptr local_13a8;
  uint local_139c;
  int local_1398;
  byte local_1391;
  double local_1390;
  _Base_ptr local_1388;
  uint local_1380;
  uint local_137c;
  _Base_ptr local_1378;
  uint local_1370;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1368;
  Trainer local_1350;
  allocator local_1311;
  string local_1310 [39];
  allocator local_12e9;
  string local_12e8 [32];
  string local_12c8 [167];
  allocator local_1221;
  string local_1220 [32];
  undefined1 local_1200 [527];
  allocator local_ff1;
  string local_ff0 [1316];
  uint local_acc;
  _Base_ptr local_ac8;
  undefined1 local_ac0;
  pair<const_unsigned_int,_unsigned_int> local_ab8;
  _Self local_ab0;
  _Self local_aa8;
  undefined1 *local_aa0;
  _Base_ptr local_a98;
  undefined1 local_a90;
  uint local_a84;
  uint *local_a80;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a78;
  undefined1 *local_a70;
  undefined1 auStack_a60 [24];
  _Self local_a48;
  _Self in_stack_fffffffffffff5c0;
  char ***in_stack_fffffffffffff5c8;
  int *in_stack_fffffffffffff5d0;
  uint local_99c;
  istringstream local_998 [384];
  string local_818 [36];
  undefined4 local_7f4;
  vector<float,_std::allocator<float>_> local_7f0;
  string local_7d8 [39];
  allocator local_7b1;
  string local_7b0 [32];
  istream local_790 [527];
  allocator local_581;
  string local_580 [36];
  undefined4 local_55c;
  allocator local_539;
  string local_538 [39];
  allocator local_511;
  string local_510 [39];
  allocator local_4e9;
  string local_4e8 [32];
  uint local_4c8;
  allocator local_4c1;
  string local_4c0 [32];
  string local_4a0 [39];
  byte local_479;
  string local_478 [36];
  int local_454;
  ostringstream local_450 [383];
  allocator local_2d1;
  string local_2d0 [32];
  double local_2b0;
  allocator local_2a1;
  string local_2a0 [32];
  uint local_280;
  allocator local_279;
  string local_278 [32];
  uint local_258;
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [48];
  variables_map local_b8 [160];
  uint local_18;
  uint local_14;
  long local_10;
  uint local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  cnn::Initialize(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8,
                  (uint)((ulong)in_stack_fffffffffffff5c0._M_node >> 0x20),
                  SUB81((ulong)in_stack_fffffffffffff5c0._M_node >> 0x18,0));
  std::operator<<((ostream *)&std::cerr,"COMMAND:");
  for (local_14 = 0; iVar4 = (int)((ulong)in_stack_ffffffffffffe1b0 >> 0x20), local_14 < local_8;
      local_14 = local_14 + 1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,' ');
    std::operator<<(poVar5,*(char **)(local_10 + (ulong)local_14 * 8));
  }
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  local_18 = 100;
  boost::program_options::variables_map::variables_map(local_b8);
  InitCommandLine(iVar4,in_stack_ffffffffffffe1a8,in_stack_ffffffffffffe1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"use_pos_tags",&local_e9);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)in_stack_ffffffffffffdde0,(key_type *)in_stack_ffffffffffffddd8);
  USE_POS = sVar6 != 0;
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"use_spelling",&local_111);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)in_stack_ffffffffffffdde0,(key_type *)in_stack_ffffffffffffddd8);
  USE_SPELLING = sVar6 != 0;
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  corpus.USE_SPELLING = (bool)(USE_SPELLING & 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"layers",&local_139);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
  puVar7 = boost::program_options::variable_value::as<unsigned_int>((variable_value *)0x485561);
  LAYERS = *puVar7;
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"input_dim",&local_161);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
  puVar7 = boost::program_options::variable_value::as<unsigned_int>((variable_value *)0x4855f4);
  INPUT_DIM = *puVar7;
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"pretrained_dim",&local_189);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
  puVar7 = boost::program_options::variable_value::as<unsigned_int>((variable_value *)0x485687);
  PRETRAINED_DIM = *puVar7;
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"hidden_dim",&local_1b1);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
  puVar7 = boost::program_options::variable_value::as<unsigned_int>((variable_value *)0x48571a);
  HIDDEN_DIM = *puVar7;
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"action_dim",&local_1d9);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
  puVar7 = boost::program_options::variable_value::as<unsigned_int>((variable_value *)0x4857ad);
  ACTION_DIM = *puVar7;
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"lstm_input_dim",&local_201);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
  puVar7 = boost::program_options::variable_value::as<unsigned_int>((variable_value *)0x485840);
  LSTM_INPUT_DIM = *puVar7;
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"pos_dim",&local_229);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
  puVar7 = boost::program_options::variable_value::as<unsigned_int>((variable_value *)0x4858d3);
  POS_DIM = *puVar7;
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"rel_dim",&local_251);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
  puVar7 = boost::program_options::variable_value::as<unsigned_int>((variable_value *)0x485966);
  REL_DIM = *puVar7;
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"beam_size",&local_279);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
  puVar7 = boost::program_options::variable_value::as<unsigned_int>((variable_value *)0x4859f9);
  uVar3 = *puVar7;
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  local_258 = uVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"unk_strategy",&local_2a1);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
  puVar7 = boost::program_options::variable_value::as<unsigned_int>((variable_value *)0x485a9b);
  uVar3 = *puVar7;
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  local_280 = uVar3;
  std::operator<<((ostream *)&std::cerr,"Unknown word strategy: ");
  if (local_280 != 1) {
    abort();
  }
  std::operator<<((ostream *)&std::cerr,"STOCHASTIC REPLACEMENT\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"unk_prob",&local_2d1);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
  pdVar8 = boost::program_options::variable_value::as<double>((variable_value *)0x485f04);
  dVar31 = *pdVar8;
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  local_2b0 = dVar31;
  if (dVar31 < 0.0) {
    __assert_fail("unk_prob >= 0.",
                  "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                  ,0x3a5,"int main(int, char **)");
  }
  if (1.0 < dVar31) {
    __assert_fail("unk_prob <= 1.",
                  "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                  ,0x3a5,"int main(int, char **)");
  }
  std::__cxx11::ostringstream::ostringstream(local_450);
  poVar5 = std::operator<<((ostream *)local_450,"parser_");
  pcVar21 = "nopos";
  if ((USE_POS & 1U) != 0) {
    pcVar21 = "pos";
  }
  poVar5 = std::operator<<(poVar5,pcVar21);
  poVar5 = std::operator<<(poVar5,'_');
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,LAYERS);
  poVar5 = std::operator<<(poVar5,'_');
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,INPUT_DIM);
  poVar5 = std::operator<<(poVar5,'_');
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,HIDDEN_DIM);
  poVar5 = std::operator<<(poVar5,'_');
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,ACTION_DIM);
  poVar5 = std::operator<<(poVar5,'_');
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,LSTM_INPUT_DIM);
  poVar5 = std::operator<<(poVar5,'_');
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,POS_DIM);
  poVar5 = std::operator<<(poVar5,'_');
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,REL_DIM);
  poVar5 = std::operator<<(poVar5,"-pid");
  _Var2 = getpid();
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,_Var2);
  std::operator<<(poVar5,".params");
  local_454 = 0;
  std::__cxx11::ostringstream::str();
  poVar5 = std::operator<<((ostream *)&std::cerr,"Writing parameters to file: ");
  poVar5 = std::operator<<(poVar5,local_478);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_479 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"training_data",&local_4c1);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
  pbVar9 = boost::program_options::variable_value::as<std::__cxx11::string>
                     ((variable_value *)0x48631a);
  std::__cxx11::string::string(local_4a0,(string *)pbVar9);
  cpyp::Corpus::load_correct_actions(in_stack_ffffffffffffe6c0,in_stack_ffffffffffffe6b8);
  std::__cxx11::string::~string(local_4a0);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e8,"UNK",&local_4e9);
  uVar3 = cpyp::Corpus::get_or_add_word
                    (in_stack_ffffffffffffdde0,(string *)in_stack_ffffffffffffddd8);
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  local_4c8 = uVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_510,"ROOT",&local_511);
  kROOT_SYMBOL = cpyp::Corpus::get_or_add_word
                           (in_stack_ffffffffffffdde0,(string *)in_stack_ffffffffffffddd8);
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"words",&local_539);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)in_stack_ffffffffffffdde0,(key_type *)in_stack_ffffffffffffddd8);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  if (sVar6 != 0) {
    local_55c = 0;
    std::allocator<float>::allocator((allocator<float> *)0x486523);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffddf0._M_current,
               (size_type)in_stack_ffffffffffffdde8._M_current,
               (value_type_conflict1 *)in_stack_ffffffffffffdde0,
               (allocator_type *)in_stack_ffffffffffffddd8);
    std::
    unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::operator[]((unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                  *)in_stack_ffffffffffffddd0,(key_type *)in_stack_ffffffffffffddc8);
    std::vector<float,_std::allocator<float>_>::operator=
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffdde0,
               (vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffddd8);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffdde0);
    std::allocator<float>::~allocator((allocator<float> *)0x48659f);
    poVar5 = std::operator<<((ostream *)&std::cerr,"Loading from ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_580,"words",&local_581);
    boost::program_options::variables_map::operator[]
              ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
    pbVar9 = boost::program_options::variable_value::as<std::__cxx11::string>
                       ((variable_value *)0x48661b);
    poVar5 = std::operator<<(poVar5,(string *)pbVar9);
    poVar5 = std::operator<<(poVar5," with");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,PRETRAINED_DIM);
    std::operator<<(poVar5," dimensions\n");
    std::__cxx11::string::~string(local_580);
    std::allocator<char>::~allocator((allocator<char> *)&local_581);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7b0,"words",&local_7b1);
    boost::program_options::variables_map::operator[]
              ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
    boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x48670e);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_790,pcVar21,_S_in);
    std::__cxx11::string::~string(local_7b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
    this_00 = local_7d8;
    std::__cxx11::string::string(this_00);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_790,this_00);
    local_7f4 = 0;
    std::allocator<float>::allocator((allocator<float> *)0x4867b0);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffddf0._M_current,
               (size_type)in_stack_ffffffffffffdde8._M_current,
               (value_type_conflict1 *)in_stack_ffffffffffffdde0,
               (allocator_type *)in_stack_ffffffffffffddd8);
    std::allocator<float>::~allocator((allocator<float> *)0x4867e4);
    std::__cxx11::string::string(local_818);
    while( true ) {
      piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_790,local_7d8);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)(piVar10 + *(long *)(*(long *)piVar10 + -0x18)));
      if (!bVar1) break;
      std::__cxx11::istringstream::istringstream(local_998,local_7d8,_S_in);
      std::operator>>((istream *)local_998,local_818);
      for (local_99c = 0; local_99c < PRETRAINED_DIM; local_99c = local_99c + 1) {
        pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                            (&local_7f0,(ulong)local_99c);
        std::istream::operator>>(local_998,pvVar11);
      }
      cpyp::Corpus::get_or_add_word(in_stack_ffffffffffffdde0,(string *)in_stack_ffffffffffffddd8);
      std::
      unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
      ::operator[]((unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                    *)in_stack_ffffffffffffddd0,(key_type *)in_stack_ffffffffffffddc8);
      std::vector<float,_std::allocator<float>_>::operator=
                (in_stack_ffffffffffffde70,
                 (vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_ffffffffffffde6c,in_stack_ffffffffffffde68));
      std::__cxx11::istringstream::~istringstream(local_998);
    }
    std::__cxx11::string::~string(local_818);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffdde0);
    std::__cxx11::string::~string(local_7d8);
    std::ifstream::~ifstream(local_790);
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x486c8e);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x486c9b);
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         *)0x486ca8);
  std::
  map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::begin((map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           *)in_stack_ffffffffffffddc8);
  local_a48._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::end((map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)in_stack_ffffffffffffddc8);
  while (bVar1 = std::operator!=((_Self *)&stack0xfffffffffffff5c0,&local_a48), bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)0x486d16);
    std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::pair
              ((pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               in_stack_ffffffffffffddd0,
               (pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               in_stack_ffffffffffffddc8);
    local_a70 = auStack_a60;
    local_a78._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_ffffffffffffddc8);
    local_a80 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   in_stack_ffffffffffffddc8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)in_stack_ffffffffffffddd0,
                              (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)in_stack_ffffffffffffddc8), bVar1) {
      puVar12 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator*(&local_a78);
      local_a84 = *puVar12;
      pVar28 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
               insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      in_stack_ffffffffffffddf0._M_current,in_stack_ffffffffffffdde8._M_current);
      local_a98 = (_Base_ptr)pVar28.first._M_node;
      local_a90 = pVar28.second;
      pmVar13 = std::
                map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              *)in_stack_ffffffffffffde10,
                             (key_type_conflict *)in_stack_ffffffffffffde08);
      *pmVar13 = *pmVar13 + 1;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_a78);
    }
    std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~pair
              ((pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               0x486e6a);
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)in_stack_ffffffffffffddd0);
  }
  local_aa0 = &stack0xfffffffffffff5d0;
  local_aa8._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::begin((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                *)in_stack_ffffffffffffddc8);
  local_ab0._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::end((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              *)in_stack_ffffffffffffddc8);
  while (bVar1 = std::operator!=(&local_aa8,&local_ab0), bVar1) {
    ppVar14 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator*
                        ((_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_> *)0x486ede
                        );
    local_ab8 = *ppVar14;
    if (local_ab8.second == 1) {
      pVar28 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
               insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      in_stack_ffffffffffffddf0._M_current,in_stack_ffffffffffffdde8._M_current);
      local_ac8 = (_Base_ptr)pVar28.first._M_node;
      local_ac0 = pVar28.second;
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_> *)
               in_stack_ffffffffffffddd0);
  }
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *)0x486f58);
  poVar5 = std::operator<<((ostream *)&std::cerr,"Number of words: ");
  pvVar15 = (void *)std::ostream::operator<<(poVar5,corpus.nwords);
  std::ostream::operator<<(pvVar15,std::endl<char,std::char_traits<char>>);
  VOCAB_SIZE = corpus.nwords + 1;
  poVar5 = std::operator<<((ostream *)&std::cerr,"Number of UTF8 chars: ");
  pvVar15 = (void *)std::ostream::operator<<(poVar5,corpus.maxChars);
  std::ostream::operator<<(pvVar15,std::endl<char,std::char_traits<char>>);
  if (0xff < corpus.maxChars) {
    CHAR_SIZE = corpus.maxChars;
  }
  ACTION_SIZE = corpus.nactions + 1;
  POS_SIZE = corpus.npos + 10;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffddf0._M_current,(size_type)in_stack_ffffffffffffdde8._M_current);
  for (local_acc = 0; uVar3 = local_acc, local_acc < corpus.nactions; local_acc = local_acc + 1) {
    pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&possible_actions,(ulong)local_acc);
    *pvVar16 = uVar3;
  }
  cnn::Model::Model((Model *)in_stack_ffffffffffffddd0);
  ParserBuilder::ParserBuilder
            (in_stack_ffffffffffffe680,in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ff0,"model",&local_ff1);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)in_stack_ffffffffffffdde0,(key_type *)in_stack_ffffffffffffddd8);
  std::__cxx11::string::~string(local_ff0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ff1);
  if (sVar6 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1220,"model",&local_1221);
    boost::program_options::variables_map::operator[]
              ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
    boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x4871f1);
    pcVar21 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_1200,pcVar21,_S_in);
    std::__cxx11::string::~string(local_1220);
    std::allocator<char>::~allocator((allocator<char> *)&local_1221);
    boost::archive::text_iarchive::text_iarchive
              ((text_iarchive *)in_stack_ffffffffffffddf0._M_current,
               (istream *)in_stack_ffffffffffffdde8._M_current,
               (uint)((ulong)in_stack_ffffffffffffdde0 >> 0x20));
    boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator>>
              ((interface_iarchive<boost::archive::text_iarchive> *)in_stack_ffffffffffffddd0,
               in_stack_ffffffffffffddc8);
    boost::archive::text_iarchive::~text_iarchive((text_iarchive *)0x487276);
    std::ifstream::~ifstream(local_1200);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12e8,"dev_data",&local_12e9);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_ffffffffffffddd0,(string *)in_stack_ffffffffffffddc8);
  pbVar9 = boost::program_options::variable_value::as<std::__cxx11::string>
                     ((variable_value *)0x4873db);
  std::__cxx11::string::string(local_12c8,(string *)pbVar9);
  cpyp::Corpus::load_correct_actionsDev(in_stack_ffffffffffffe4c0,in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string(local_12c8);
  std::__cxx11::string::~string(local_12e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12e9);
  if ((USE_SPELLING & 1U) != 0) {
    VOCAB_SIZE = corpus.nwords + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1310,"train",&local_1311);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)in_stack_ffffffffffffdde0,(key_type *)in_stack_ffffffffffffddd8);
  std::__cxx11::string::~string(local_1310);
  std::allocator<char>::~allocator((allocator<char> *)&local_1311);
  if (sVar6 != 0) {
    signal(2,signal_callback_handler);
    cnn::SimpleSGDTrainer::SimpleSGDTrainer
              ((SimpleSGDTrainer *)in_stack_ffffffffffffdde0,in_stack_ffffffffffffddd8,
               (real)((ulong)in_stack_ffffffffffffddd0 >> 0x20),SUB84(in_stack_ffffffffffffddd0,0));
    local_1350.eta_decay = 0.08;
    poVar5 = std::operator<<((ostream *)&std::cerr,"Training started.");
    std::operator<<(poVar5,"\n");
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x4875e6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               in_stack_ffffffffffffddf0._M_current,(size_type)in_stack_ffffffffffffdde8._M_current,
               (allocator_type *)in_stack_ffffffffffffdde0);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x487612);
    for (local_1370 = 0; uVar3 = local_1370, local_1370 < corpus.nsentences;
        local_1370 = local_1370 + 1) {
      pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_1368,(ulong)local_1370);
      *pvVar16 = uVar3;
    }
    local_1378 = (_Base_ptr)0x0;
    puVar7 = std::min<unsigned_int>(&local_18,&corpus.nsentences);
    local_18 = *puVar7;
    local_137c = corpus.nsentences;
    poVar5 = std::operator<<((ostream *)&std::cerr,"NUMBER OF TRAINING SENTENCES: ");
    pvVar15 = (void *)std::ostream::operator<<(poVar5,corpus.nsentences);
    std::ostream::operator<<(pvVar15,std::endl<char,std::char_traits<char>>);
    local_1380 = 0;
    local_1388 = (_Base_ptr)0x0;
    local_1390 = 0.0;
    local_1391 = 1;
    local_1398 = -1;
    while (((requested_stop ^ 0xffU) & 1) != 0) {
      local_1398 = local_1398 + 1;
      for (local_139c = 0; local_139c < local_18; local_139c = local_139c + 1) {
        if (local_137c == corpus.nsentences) {
          local_137c = 0;
          if ((local_1391 & 1) == 0) {
            cnn::Trainer::update_epoch(&local_1350,1.0);
          }
          else {
            local_1391 = 0;
          }
          std::operator<<((ostream *)&std::cerr,"**SHUFFLE\n");
          local_13a8 = (_Base_ptr)
                       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_ffffffffffffddc8);
          local_13b0 = (_Base_ptr)
                       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_ffffffffffffddc8);
          std::
          random_shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8);
        }
        local_1378 = (_Base_ptr)((double)local_1378 + 1.0);
        pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_1368,(ulong)local_137c);
        local_13d8._M_right._4_4_ = *pvVar16;
        in_stack_ffffffffffffe080 =
             (_Base_ptr)
             std::
             map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](in_stack_ffffffffffffde10,(key_type *)in_stack_ffffffffffffde08);
        local_13b8 = in_stack_ffffffffffffe080;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (in_stack_ffffffffffffde20,in_stack_ffffffffffffde18);
        if (local_280 == 1) {
          local_13e0 = &local_13d8;
          local_13e8._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_ffffffffffffddc8);
          local_13f0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                          in_stack_ffffffffffffddc8);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)in_stack_ffffffffffffddd0,
                                    (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)in_stack_ffffffffffffddc8), bVar1) {
            local_13f8 = __gnu_cxx::
                         __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         ::operator*(&local_13e8);
            sVar17 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)in_stack_ffffffffffffdde0,
                             (key_type_conflict *)in_stack_ffffffffffffddd8);
            if ((sVar17 != 0) &&
               (in_stack_ffffffffffffe074 = cnn::rand01(),
               (double)in_stack_ffffffffffffe074 < local_2b0)) {
              *local_13f8 = local_4c8;
            }
            __gnu_cxx::
            __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator++(&local_13e8);
          }
        }
        pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_1368,(ulong)local_137c);
        local_1404 = *pvVar16;
        in_stack_ffffffffffffe068 =
             std::
             map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](in_stack_ffffffffffffde10,(key_type *)in_stack_ffffffffffffde08);
        local_1400 = in_stack_ffffffffffffe068;
        pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_1368,(ulong)local_137c);
        local_1414 = *pvVar16;
        in_stack_ffffffffffffe060 =
             (Model *)std::
                      map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      ::operator[](in_stack_ffffffffffffde10,(key_type *)in_stack_ffffffffffffde08);
        local_1410 = in_stack_ffffffffffffe060;
        cnn::ComputationGraph::ComputationGraph(in_stack_ffffffffffffde00);
        in_stack_ffffffffffffdde0 = (Corpus *)&local_1388;
        in_stack_ffffffffffffddd8 = (Model *)&corpus.intToWords;
        in_stack_ffffffffffffddd0 = (ParserBuilder *)&corpus.actions;
        in_stack_ffffffffffffddc8 = local_1410;
        ParserBuilder::log_prob_parser
                  (in_stack_ffffffffffffe938,in_stack_ffffffffffffe930,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffe928,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffe920,
                   in_stack_ffffffffffffe918,in_stack_ffffffffffffe950,in_stack_ffffffffffffe958,
                   in_stack_ffffffffffffe960,in_stack_ffffffffffffe968);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdde0)
        ;
        in_stack_ffffffffffffe058 =
             cnn::ComputationGraph::incremental_forward((ComputationGraph *)0x487ba6);
        in_stack_ffffffffffffe054 = cnn::as_scalar((Tensor *)0x487bbd);
        local_1470 = (_Base_ptr)(double)in_stack_ffffffffffffe054;
        if ((double)local_1470 < 0.0) {
          in_stack_ffffffffffffe048 =
               std::operator<<((ostream *)&std::cerr,"Log prob < 0 on sentence ");
          pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&local_1368,(ulong)local_137c);
          poVar5 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffe048,*pvVar16);
          poVar5 = std::operator<<(poVar5,": lp=");
          pvVar15 = (void *)std::ostream::operator<<(poVar5,(double)local_1470);
          std::ostream::operator<<(pvVar15,std::endl<char,std::char_traits<char>>);
          if ((double)local_1470 < 0.0) {
            __assert_fail("lp >= 0.0",
                          "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                          ,0x416,"int main(int, char **)");
          }
        }
        cnn::ComputationGraph::backward((ComputationGraph *)0x487cf8);
        cnn::SimpleSGDTrainer::update
                  ((SimpleSGDTrainer *)in_stack_ffffffffffffdde0,
                   (real)((ulong)in_stack_ffffffffffffddd8 >> 0x20));
        local_1390 = (double)local_1470 + local_1390;
        local_137c = local_137c + 1;
        sVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1410);
        local_1380 = local_1380 + (int)sVar18;
        cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)in_stack_ffffffffffffddd0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdde0)
        ;
      }
      cnn::Trainer::status((Trainer *)in_stack_ffffffffffffddd0);
      poVar5 = std::operator<<((ostream *)&std::cerr,"update #");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1398);
      poVar5 = std::operator<<(poVar5," (epoch ");
      poVar5 = (ostream *)
               std::ostream::operator<<(poVar5,(double)local_1378 / (double)corpus.nsentences);
      poVar5 = std::operator<<(poVar5,")\tllh: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1390);
      poVar5 = std::operator<<(poVar5," ppl: ");
      dVar31 = exp(local_1390 / (double)local_1380);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar31);
      poVar5 = std::operator<<(poVar5," err: ");
      pvVar15 = (void *)std::ostream::operator<<
                                  (poVar5,((double)local_1380 - (double)local_1388) /
                                          (double)local_1380);
      std::ostream::operator<<(pvVar15,std::endl<char,std::char_traits<char>>);
      local_1388 = (_Base_ptr)0x0;
      local_1380 = 0;
      local_1390 = 0.0;
      main::logc = main::logc + 1;
      if (main::logc % 0x19 == 1) {
        local_1474 = corpus.nsentencesDev;
        local_1480 = 0.0;
        local_1488 = 0.0;
        local_1490 = 0.0;
        local_1498 = 0.0;
        local_14a0 = 0.0;
        local_14a8 = std::chrono::_V2::system_clock::now();
        for (local_14ac = 0; local_14ac < local_1474; local_14ac = local_14ac + 1) {
          local_14bc = local_14ac;
          local_14b8 = std::
                       map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                       ::operator[](in_stack_ffffffffffffde10,(key_type *)in_stack_ffffffffffffde08)
          ;
          local_14cc = local_14ac;
          local_14c8 = std::
                       map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                       ::operator[](in_stack_ffffffffffffde10,(key_type *)in_stack_ffffffffffffde08)
          ;
          local_14dc = local_14ac;
          local_14d8 = std::
                       map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                       ::operator[](in_stack_ffffffffffffde10,(key_type *)in_stack_ffffffffffffde08)
          ;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (in_stack_ffffffffffffde20,in_stack_ffffffffffffde18);
          if ((USE_SPELLING & 1U) == 0) {
            local_1500 = local_14f8;
            local_1508._M_current =
                 (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    in_stack_ffffffffffffddc8);
            local_1510 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                            in_stack_ffffffffffffddc8);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)in_stack_ffffffffffffddd0,
                                      (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)in_stack_ffffffffffffddc8), bVar1) {
              local_1518 = __gnu_cxx::
                           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           ::operator*(&local_1508);
              sVar17 = std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)in_stack_ffffffffffffdde0,
                             (key_type_conflict *)in_stack_ffffffffffffddd8);
              if (sVar17 == 0) {
                *local_1518 = local_4c8;
              }
              __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&local_1508);
            }
          }
          cnn::ComputationGraph::ComputationGraph(in_stack_ffffffffffffde00);
          local_1588.all_params.
          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1588.all_params.
          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1588.all_params.
          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          in_stack_ffffffffffffddc8 = &local_1588;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x488200);
          in_stack_ffffffffffffdde0 = (Corpus *)&local_1490;
          in_stack_ffffffffffffddd8 = (Model *)&corpus.intToWords;
          in_stack_ffffffffffffddd0 = (ParserBuilder *)&corpus.actions;
          ParserBuilder::log_prob_parser
                    (in_stack_ffffffffffffe938,in_stack_ffffffffffffe930,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffe928,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffe920,in_stack_ffffffffffffe918,in_stack_ffffffffffffe950,
                     in_stack_ffffffffffffe958,in_stack_ffffffffffffe960,in_stack_ffffffffffffe968);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffdde0);
          local_1590 = 0;
          local_1480 = local_1480 - 0.0;
          sVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_14d8);
          auVar26._8_4_ = (int)(sVar18 >> 0x20);
          auVar26._0_8_ = sVar18;
          auVar26._12_4_ = 0x45300000;
          local_1488 = local_1488 +
                       (auVar26._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar18) - 4503599627370496.0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_14b8);
          ParserBuilder::compute_heads
                    ((uint)((ulong)in_stack_ffffffffffffdf68 >> 0x20),
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffdf60,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffdf58,
                     (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_ffffffffffffdf50);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_14b8);
          ParserBuilder::compute_heads
                    ((uint)((ulong)in_stack_ffffffffffffdf68 >> 0x20),
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffdf60,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffdf58,
                     (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_ffffffffffffdf50);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_14b8);
          uVar3 = compute_correct((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)in_stack_ffffffffffffde10,in_stack_ffffffffffffde08,
                                  (uint)((ulong)in_stack_ffffffffffffde00 >> 0x20));
          local_1498 = local_1498 + (double)uVar3;
          sVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_14b8);
          lVar19 = sVar18 - 1;
          auVar24._8_4_ = (int)((ulong)lVar19 >> 0x20);
          auVar24._0_8_ = lVar19;
          auVar24._12_4_ = 0x45300000;
          local_14a0 = (auVar24._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0) + local_14a0;
          std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     0x4883f6);
          std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     0x488403);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffdde0);
          cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)in_stack_ffffffffffffddd0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffdde0);
        }
        local_15f8 = std::chrono::_V2::system_clock::now();
        poVar5 = std::operator<<((ostream *)&std::cerr,"  **dev (iter=");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1398);
        poVar5 = std::operator<<(poVar5," epoch=");
        poVar5 = (ostream *)
                 std::ostream::operator<<(poVar5,(double)local_1378 / (double)corpus.nsentences);
        poVar5 = std::operator<<(poVar5,")\tllh=");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1480);
        in_stack_ffffffffffffdf68 = std::operator<<(poVar5," ppl: ");
        dVar31 = exp(local_1480 / local_1488);
        in_stack_ffffffffffffdf60 =
             (ostream *)std::ostream::operator<<(in_stack_ffffffffffffdf68,dVar31);
        in_stack_ffffffffffffdf58 = std::operator<<(in_stack_ffffffffffffdf60," err: ");
        in_stack_ffffffffffffdf50 =
             (ostream *)
             std::ostream::operator<<
                       (in_stack_ffffffffffffdf58,(local_1488 - local_1490) / local_1488);
        poVar5 = std::operator<<(in_stack_ffffffffffffdf50," uas: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1498 / local_14a0);
        poVar5 = std::operator<<(poVar5,"\t[");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1474);
        poVar5 = std::operator<<(poVar5," sents in ");
        std::chrono::operator-
                  ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_ffffffffffffddd8,
                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_ffffffffffffddd0);
        std::chrono::duration<double,std::ratio<1l,1000l>>::
        duration<long,std::ratio<1l,1000000000l>,void>
                  ((duration<double,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffdde0,
                   (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffddd8);
        rVar23 = std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_1600);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar23);
        poVar5 = std::operator<<(poVar5," ms]");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        if ((double)local_454 < local_1498) {
          local_454 = (int)local_1498;
          std::ofstream::ofstream(local_1808,local_478,_S_out);
          boost::archive::text_oarchive::text_oarchive
                    ((text_oarchive *)in_stack_ffffffffffffddf0._M_current,
                     (ostream *)in_stack_ffffffffffffdde8._M_current,
                     (uint)((ulong)in_stack_ffffffffffffdde0 >> 0x20));
          boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator<<
                    ((interface_oarchive<boost::archive::text_oarchive> *)in_stack_ffffffffffffddd0,
                     in_stack_ffffffffffffddc8);
          if ((local_479 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_18b0," latest_model",&local_18b1);
            std::allocator<char>::~allocator((allocator<char> *)&local_18b1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_18f8,"rm -f ",&local_18f9);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffddd8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffddd0);
            pcVar21 = (char *)std::__cxx11::string::c_str();
            iVar4 = system(pcVar21);
            bVar1 = false;
            if (iVar4 == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1960,"ln -s ",&local_1961);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffddd8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffddd0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffddd8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffddd0);
              pcVar21 = (char *)std::__cxx11::string::c_str();
              iVar4 = system(pcVar21);
              bVar1 = iVar4 == 0;
              std::__cxx11::string::~string(local_1920);
              std::__cxx11::string::~string((string *)&stack0xffffffffffffe6c0);
              std::__cxx11::string::~string(local_1960);
              std::allocator<char>::~allocator((allocator<char> *)&local_1961);
            }
            std::__cxx11::string::~string(local_18d8);
            std::__cxx11::string::~string(local_18f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_18f9);
            if (bVar1) {
              poVar5 = std::operator<<((ostream *)&std::cerr,"Created ");
              poVar5 = std::operator<<(poVar5,local_18b0);
              poVar5 = std::operator<<(poVar5," as a soft link to ");
              poVar5 = std::operator<<(poVar5,local_478);
              poVar5 = std::operator<<(poVar5," for convenience.");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
            local_479 = 1;
            std::__cxx11::string::~string(local_18b0);
          }
          boost::archive::text_oarchive::~text_oarchive((text_oarchive *)0x488d1c);
          std::ofstream::~ofstream(local_1808);
        }
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdde0);
    cnn::SimpleSGDTrainer::~SimpleSGDTrainer((SimpleSGDTrainer *)0x488d68);
  }
  local_1970 = 0.0;
  local_1978 = 0.0;
  dVar32 = 0.0;
  dVar31 = 0.0;
  dVar30 = 0.0;
  local_1998 = std::chrono::_V2::system_clock::now();
  local_199c = corpus.nsentencesDev;
  for (local_19a0 = 0; local_19a0 < local_199c; local_19a0 = local_19a0 + 1) {
    local_19ac = local_19a0;
    local_19a8 = std::
                 map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](in_stack_ffffffffffffde10,(key_type *)in_stack_ffffffffffffde08);
    local_19bc = local_19a0;
    local_19b8 = std::
                 map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](in_stack_ffffffffffffde10,(key_type *)in_stack_ffffffffffffde08);
    local_19cc = local_19a0;
    local_19c8 = std::
                 map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[]((map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               *)in_stack_ffffffffffffde10,(key_type *)in_stack_ffffffffffffde08);
    local_19dc = local_19a0;
    local_19d8 = std::
                 map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](in_stack_ffffffffffffde10,(key_type *)in_stack_ffffffffffffde08);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_ffffffffffffde20,in_stack_ffffffffffffde18);
    if ((USE_SPELLING & 1U) == 0) {
      local_1a00 = local_19f8;
      local_1a08._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              in_stack_ffffffffffffddc8);
      local_1a58.gradient_norm_scratch =
           (float *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               in_stack_ffffffffffffddc8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)in_stack_ffffffffffffddd0,
                                (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)in_stack_ffffffffffffddc8), bVar1) {
        local_1a58.lookup_params.
        super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)__gnu_cxx::
                      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator*(&local_1a08);
        sVar17 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                 count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       in_stack_ffffffffffffdde0,(key_type_conflict *)in_stack_ffffffffffffddd8);
        if (sVar17 == 0) {
          *(uint *)local_1a58.lookup_params.
                   super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage = local_4c8;
        }
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_1a08);
      }
    }
    uVar29 = (undefined4)((ulong)in_stack_ffffffffffffddd0 >> 0x20);
    cnn::ComputationGraph::ComputationGraph(in_stack_ffffffffffffde00);
    local_1a58.all_params.
    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x489016);
    if (local_258 == 1) {
      local_1aa8 = 0;
      uStack_1aa0 = 0;
      local_1a98 = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x489070);
      in_stack_ffffffffffffdde0 = (Corpus *)&stack0xffffffffffffe680;
      in_stack_ffffffffffffddd8 = (Model *)&corpus.intToWords;
      in_stack_ffffffffffffddd0 = (ParserBuilder *)&corpus.actions;
      ParserBuilder::log_prob_parser
                (in_stack_ffffffffffffe938,in_stack_ffffffffffffe930,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffe928,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffe920,
                 in_stack_ffffffffffffe918,in_stack_ffffffffffffe950,in_stack_ffffffffffffe958,
                 in_stack_ffffffffffffe960,in_stack_ffffffffffffe968);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdde0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffddd8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdde0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdde0);
    }
    else {
      in_stack_ffffffffffffddd8 = &local_1a58;
      in_stack_ffffffffffffddd0 = (ParserBuilder *)CONCAT44(uVar29,local_258);
      ParserBuilder::log_prob_parser_beam
                ((ParserBuilder *)in_stack_ffffffffffffdde8._M_current,
                 (ComputationGraph *)in_stack_ffffffffffffdde0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffddd8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffddd0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&corpus.actions,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffde00,(uint)in_stack_ffffffffffffde08,
                 (double *)in_stack_ffffffffffffde10);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdde0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffddd8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdde0);
    }
    local_1970 = local_1970 -
                 (double)local_1a58.all_params.
                         super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    sVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_19d8);
    auVar27._8_4_ = (int)(sVar18 >> 0x20);
    auVar27._0_8_ = sVar18;
    auVar27._12_4_ = 0x45300000;
    local_1978 = local_1978 +
                 (auVar27._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar18) - 4503599627370496.0);
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x489246);
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x489253);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_19a8);
    ParserBuilder::compute_heads
              ((uint)((ulong)in_stack_ffffffffffffdf68 >> 0x20),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdf60,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffdf58,
               (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffdf50);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_19a8);
    ParserBuilder::compute_heads
              ((uint)((ulong)in_stack_ffffffffffffdf68 >> 0x20),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdf60,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffdf58,
               (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffdf50);
    in_stack_ffffffffffffddc8 = &local_1b20;
    output_conll((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
                 in_stack_ffffffffffffe068,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffe060,
                 (map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe058,
                 (map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffe054,in_stack_ffffffffffffe050),
                 (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 in_stack_ffffffffffffe048,
                 (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe080);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_19a8);
    uVar3 = compute_correct((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)in_stack_ffffffffffffde10,in_stack_ffffffffffffde08,
                            (uint)((ulong)in_stack_ffffffffffffde00 >> 0x20));
    dVar31 = dVar31 + (double)uVar3;
    sVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_19a8);
    lVar19 = sVar18 - 1;
    auVar25._8_4_ = (int)((ulong)lVar19 >> 0x20);
    auVar25._0_8_ = lVar19;
    auVar25._12_4_ = 0x45300000;
    dVar30 = (auVar25._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0) + dVar30;
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               0x4893a9);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               0x4893b6);
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x4893c3);
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x4893d0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdde0);
    cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)in_stack_ffffffffffffddd0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdde0);
  }
  local_1b88 = std::chrono::_V2::system_clock::now();
  poVar5 = std::operator<<((ostream *)&std::cerr,"TEST llh=");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1970);
  poVar5 = std::operator<<(poVar5," ppl: ");
  dVar22 = exp(local_1970 / local_1978);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar22);
  poVar5 = std::operator<<(poVar5," err: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(local_1978 - dVar32) / local_1978);
  poVar5 = std::operator<<(poVar5," uas: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar31 / dVar30);
  poVar5 = std::operator<<(poVar5,"\t[");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_199c);
  poVar5 = std::operator<<(poVar5," sents in ");
  std::chrono::operator-
            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_ffffffffffffddd8,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_ffffffffffffddd0);
  std::chrono::duration<double,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffdde0,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffddd8);
  rVar23 = std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_1b90);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar23);
  this = (Model *)std::operator<<(poVar5," ms]");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  local_1b9c = 0;
  while( true ) {
    uVar20 = (ulong)local_1b9c;
    sVar18 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&corpus.actions);
    if (sVar18 <= uVar20) break;
    local_1b9c = local_1b9c + 1;
  }
  ParserBuilder::~ParserBuilder(in_stack_ffffffffffffddd0);
  cnn::Model::~Model(this);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x489721);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x48972e);
  std::__cxx11::string::~string(local_478);
  std::__cxx11::ostringstream::~ostringstream(local_450);
  boost::program_options::variables_map::~variables_map((variables_map *)in_stack_ffffffffffffddd0);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  cnn::Initialize(argc, argv);

  cerr << "COMMAND:"; 
  for (unsigned i = 0; i < static_cast<unsigned>(argc); ++i) cerr << ' ' << argv[i];
  cerr << endl;
  unsigned status_every_i_iterations = 100;

  po::variables_map conf;
  InitCommandLine(argc, argv, &conf);
  USE_POS = conf.count("use_pos_tags");

  USE_SPELLING=conf.count("use_spelling"); //Miguel
  corpus.USE_SPELLING=USE_SPELLING;

  LAYERS = conf["layers"].as<unsigned>();
  INPUT_DIM = conf["input_dim"].as<unsigned>();
  PRETRAINED_DIM = conf["pretrained_dim"].as<unsigned>();
  HIDDEN_DIM = conf["hidden_dim"].as<unsigned>();
  ACTION_DIM = conf["action_dim"].as<unsigned>();
  LSTM_INPUT_DIM = conf["lstm_input_dim"].as<unsigned>();
  POS_DIM = conf["pos_dim"].as<unsigned>();
  REL_DIM = conf["rel_dim"].as<unsigned>();
  const unsigned beam_size = conf["beam_size"].as<unsigned>();
  const unsigned unk_strategy = conf["unk_strategy"].as<unsigned>();
  cerr << "Unknown word strategy: ";
  if (unk_strategy == 1) {
    cerr << "STOCHASTIC REPLACEMENT\n";
  } else {
    abort();
  }
  const double unk_prob = conf["unk_prob"].as<double>();
  assert(unk_prob >= 0.); assert(unk_prob <= 1.);
  ostringstream os;
  os << "parser_" << (USE_POS ? "pos" : "nopos")
     << '_' << LAYERS
     << '_' << INPUT_DIM
     << '_' << HIDDEN_DIM
     << '_' << ACTION_DIM
     << '_' << LSTM_INPUT_DIM
     << '_' << POS_DIM
     << '_' << REL_DIM
     << "-pid" << getpid() << ".params";
  int best_correct_heads = 0;
  const string fname = os.str();
  cerr << "Writing parameters to file: " << fname << endl;
  bool softlinkCreated = false;
  corpus.load_correct_actions(conf["training_data"].as<string>());	
  const unsigned kUNK = corpus.get_or_add_word(cpyp::Corpus::UNK);
  kROOT_SYMBOL = corpus.get_or_add_word(ROOT_SYMBOL);

  if (conf.count("words")) {
    pretrained[kUNK] = vector<float>(PRETRAINED_DIM, 0);
    cerr << "Loading from " << conf["words"].as<string>() << " with" << PRETRAINED_DIM << " dimensions\n";
    ifstream in(conf["words"].as<string>().c_str());
    string line;
    getline(in, line);
    vector<float> v(PRETRAINED_DIM, 0);
    string word;
    while (getline(in, line)) {
      istringstream lin(line);
      lin >> word;
      for (unsigned i = 0; i < PRETRAINED_DIM; ++i) lin >> v[i];
      unsigned id = corpus.get_or_add_word(word);
      pretrained[id] = v;
    }
  }

  set<unsigned> training_vocab; // words available in the training corpus
  set<unsigned> singletons;
  {  // compute the singletons in the parser's training data
    map<unsigned, unsigned> counts;
    for (auto sent : corpus.sentences)
      for (auto word : sent.second) { training_vocab.insert(word); counts[word]++; }
    for (auto wc : counts)
      if (wc.second == 1) singletons.insert(wc.first);
  }

  cerr << "Number of words: " << corpus.nwords << endl;
  VOCAB_SIZE = corpus.nwords + 1;

  cerr << "Number of UTF8 chars: " << corpus.maxChars << endl;
  if (corpus.maxChars>255) CHAR_SIZE=corpus.maxChars;

  ACTION_SIZE = corpus.nactions + 1;
  //POS_SIZE = corpus.npos + 1;
  POS_SIZE = corpus.npos + 10;
  possible_actions.resize(corpus.nactions);
  for (unsigned i = 0; i < corpus.nactions; ++i)
    possible_actions[i] = i;

  Model model;
  ParserBuilder parser(&model, pretrained);
  if (conf.count("model")) {
    ifstream in(conf["model"].as<string>().c_str());
    boost::archive::text_iarchive ia(in);
    ia >> model;
  }

  // OOV words will be replaced by UNK tokens
  corpus.load_correct_actionsDev(conf["dev_data"].as<string>());
  if (USE_SPELLING) VOCAB_SIZE = corpus.nwords + 1;
  //TRAINING
  if (conf.count("train")) {
    signal(SIGINT, signal_callback_handler);
    SimpleSGDTrainer sgd(&model);
    //MomentumSGDTrainer sgd(&model);
    sgd.eta_decay = 0.08;
    //sgd.eta_decay = 0.05;
    cerr << "Training started."<<"\n";
    vector<unsigned> order(corpus.nsentences);
    for (unsigned i = 0; i < corpus.nsentences; ++i)
      order[i] = i;
    double tot_seen = 0;
    status_every_i_iterations = min(status_every_i_iterations, corpus.nsentences);
    unsigned si = corpus.nsentences;
    cerr << "NUMBER OF TRAINING SENTENCES: " << corpus.nsentences << endl;
    unsigned trs = 0;
    double right = 0;
    double llh = 0;
    bool first = true;
    int iter = -1;
    while(!requested_stop) {
      ++iter;
      for (unsigned sii = 0; sii < status_every_i_iterations; ++sii) {
           if (si == corpus.nsentences) {
             si = 0;
             if (first) { first = false; } else { sgd.update_epoch(); }
             cerr << "**SHUFFLE\n";
             random_shuffle(order.begin(), order.end());
           }
           tot_seen += 1;
           const vector<unsigned>& sentence=corpus.sentences[order[si]];
           vector<unsigned> tsentence=sentence;
           if (unk_strategy == 1) {
             for (auto& w : tsentence)
               if (singletons.count(w) && cnn::rand01() < unk_prob) w = kUNK;
           }
	   const vector<unsigned>& sentencePos=corpus.sentencesPos[order[si]]; 
	   const vector<unsigned>& actions=corpus.correct_act_sent[order[si]];
           ComputationGraph hg;
           parser.log_prob_parser(&hg,sentence,tsentence,sentencePos,actions,corpus.actions,corpus.intToWords,&right);
           double lp = as_scalar(hg.incremental_forward());
           if (lp < 0) {
             cerr << "Log prob < 0 on sentence " << order[si] << ": lp=" << lp << endl;
             assert(lp >= 0.0);
           }
           hg.backward();
           sgd.update(1.0);
           llh += lp;
           ++si;
           trs += actions.size();
      }
      sgd.status();
      cerr << "update #" << iter << " (epoch " << (tot_seen / corpus.nsentences) << ")\tllh: "<< llh<<" ppl: " << exp(llh / trs) << " err: " << (trs - right) / trs << endl;
      llh = trs = right = 0;

      static int logc = 0;
      ++logc;
      if (logc % 25 == 1) { // report on dev set
        unsigned dev_size = corpus.nsentencesDev;
        // dev_size = 100;
        double llh = 0;
        double trs = 0;
        double right = 0;
        double correct_heads = 0;
        double total_heads = 0;
        auto t_start = std::chrono::high_resolution_clock::now();
        for (unsigned sii = 0; sii < dev_size; ++sii) {
           const vector<unsigned>& sentence=corpus.sentencesDev[sii];
	   const vector<unsigned>& sentencePos=corpus.sentencesPosDev[sii]; 
	   const vector<unsigned>& actions=corpus.correct_act_sentDev[sii];
           vector<unsigned> tsentence=sentence;
	   if (!USE_SPELLING) {
                for (auto& w : tsentence)
                    if (training_vocab.count(w) == 0) w = kUNK;
           }

           ComputationGraph hg;
	   vector<unsigned> pred = parser.log_prob_parser(&hg,sentence,tsentence,sentencePos,vector<unsigned>(),corpus.actions,corpus.intToWords,&right);
	   double lp = 0;
           //vector<unsigned> pred = parser.log_prob_parser_beam(&hg,sentence,sentencePos,corpus.actions,beam_size,&lp);
           llh -= lp;
           trs += actions.size();
           map<int,int> ref = parser.compute_heads(sentence.size(), actions, corpus.actions);
           map<int,int> hyp = parser.compute_heads(sentence.size(), pred, corpus.actions);
           //output_conll(sentence, corpus.intToWords, ref, hyp);
           correct_heads += compute_correct(ref, hyp, sentence.size() - 1);
           total_heads += sentence.size() - 1;
        }
        auto t_end = std::chrono::high_resolution_clock::now();
        cerr << "  **dev (iter=" << iter << " epoch=" << (tot_seen / corpus.nsentences) << ")\tllh=" << llh << " ppl: " << exp(llh / trs) << " err: " << (trs - right) / trs << " uas: " << (correct_heads / total_heads) << "\t[" << dev_size << " sents in " << std::chrono::duration<double, std::milli>(t_end-t_start).count() << " ms]" << endl;
        if (correct_heads > best_correct_heads) {
          best_correct_heads = correct_heads;
          ofstream out(fname);
          boost::archive::text_oarchive oa(out);
          oa << model;
          // Create a soft link to the most recent model in order to make it
          // easier to refer to it in a shell script.
          if (!softlinkCreated) {
            string softlink = " latest_model";
            if (system((string("rm -f ") + softlink).c_str()) == 0 && 
                system((string("ln -s ") + fname + softlink).c_str()) == 0) {
              cerr << "Created " << softlink << " as a soft link to " << fname 
                   << " for convenience." << endl;
            }
            softlinkCreated = true;
          }
        }
      }
    }
  } // should do training?
  if (true) { // do test evaluation
    double llh = 0;
    double trs = 0;
    double right = 0;
    double correct_heads = 0;
    double total_heads = 0;
    auto t_start = std::chrono::high_resolution_clock::now();
    unsigned corpus_size = corpus.nsentencesDev;
    for (unsigned sii = 0; sii < corpus_size; ++sii) {
      const vector<unsigned>& sentence=corpus.sentencesDev[sii];
      const vector<unsigned>& sentencePos=corpus.sentencesPosDev[sii]; 
      const vector<string>& sentenceUnkStr=corpus.sentencesStrDev[sii]; 
      const vector<unsigned>& actions=corpus.correct_act_sentDev[sii];
      vector<unsigned> tsentence=sentence;
      if (!USE_SPELLING) {
        for (auto& w : tsentence)
	  if (training_vocab.count(w) == 0) w = kUNK;
      }
      ComputationGraph cg;
      double lp = 0;
      vector<unsigned> pred;
      if (beam_size == 1)
        pred = parser.log_prob_parser(&cg,sentence,tsentence,sentencePos,vector<unsigned>(),corpus.actions,corpus.intToWords,&right);
      else
        pred = parser.log_prob_parser_beam(&cg,sentence,tsentence,sentencePos,corpus.actions,beam_size,&lp);
      llh -= lp;
      trs += actions.size();
      map<int, string> rel_ref, rel_hyp;
      map<int,int> ref = parser.compute_heads(sentence.size(), actions, corpus.actions, &rel_ref);
      map<int,int> hyp = parser.compute_heads(sentence.size(), pred, corpus.actions, &rel_hyp);
      output_conll(sentence, sentencePos, sentenceUnkStr, corpus.intToWords, corpus.intToPos, hyp, rel_hyp);
      correct_heads += compute_correct(ref, hyp, sentence.size() - 1);
      total_heads += sentence.size() - 1;
    }
    auto t_end = std::chrono::high_resolution_clock::now();
    cerr << "TEST llh=" << llh << " ppl: " << exp(llh / trs) << " err: " << (trs - right) / trs << " uas: " << (correct_heads / total_heads) << "\t[" << corpus_size << " sents in " << std::chrono::duration<double, std::milli>(t_end-t_start).count() << " ms]" << endl;
  }
  for (unsigned i = 0; i < corpus.actions.size(); ++i) {
    //cerr << corpus.actions[i] << '\t' << parser.p_r->values[i].transpose() << endl;
    //cerr << corpus.actions[i] << '\t' << parser.p_p2a->values.col(i).transpose() << endl;
  }
}